

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  pointer ppVar1;
  ostream *poVar2;
  cmState *this_00;
  string *psVar3;
  char *pcVar4;
  pointer ppVar5;
  cmListFileContext lfc;
  cmStateDirectory cmDir;
  undefined1 local_c0 [32];
  string local_a0;
  cmStateDirectory local_78;
  string local_50;
  
  pcVar4 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar4 = "keyword";
  }
  poVar2 = std::operator<<(s,"The uses of the ");
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2," signature are here:\n");
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmStateSnapshot::GetDirectory(&local_78,(cmStateSnapshot *)local_c0);
  ppVar1 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    if (ppVar5->first == sig) {
      cmListFileContext::cmListFileContext((cmListFileContext *)local_c0,&ppVar5->second);
      this_00 = cmMakefile::GetState(this->Makefile);
      psVar3 = cmState::GetSourceDirectory_abi_cxx11_(this_00);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_50,&local_78,psVar3,(string *)(local_c0 + 0x20));
      std::__cxx11::string::operator=((string *)(local_c0 + 0x20),(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar2 = std::operator<<(s," * ");
      poVar2 = operator<<(poVar2,(cmListFileContext *)local_c0);
      std::endl<char,std::char_traits<char>>(poVar2);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_c0);
    }
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  cmStateDirectory cmDir =
    this->GetMakefile()->GetStateSnapshot().GetDirectory();
  for (auto const& cmd : this->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmDir.ConvertToRelPathIfNotContained(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}